

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_setmetatable(lua_State *L,int objindex)

{
  int iVar1;
  int iVar2;
  GCObject *o;
  int in_ESI;
  lua_State *in_RDI;
  Table *mt;
  TValue *obj;
  GCObject *v;
  undefined4 in_stack_fffffffffffffff0;
  
  o = (GCObject *)index2adr(in_RDI,in_ESI);
  if (in_RDI->top[-1].tt == 0) {
    v = (GCObject *)0x0;
  }
  else {
    v = in_RDI->top[-1].value.gc;
  }
  iVar1._0_1_ = *(lu_byte *)((long)o + 8);
  iVar1._1_1_ = *(lu_byte *)((long)o + 9);
  iVar1._2_2_ = *(undefined2 *)((long)o + 10);
  if (iVar1 == 5) {
    (((o->gch).next)->h).metatable = (Table *)v;
    if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((o->gch).next)->gch).marked & 4) != 0)) {
      luaC_barrierback(in_RDI,&((o->gch).next)->h);
    }
  }
  else if (iVar1 == 7) {
    (((o->gch).next)->h).metatable = (Table *)v;
    if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((o->gch).next)->gch).marked & 4) != 0)) {
      luaC_barrierf((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),o,v);
    }
  }
  else {
    iVar2._0_1_ = *(lu_byte *)((long)o + 8);
    iVar2._1_1_ = *(lu_byte *)((long)o + 9);
    iVar2._2_2_ = *(undefined2 *)((long)o + 10);
    in_RDI->l_G->mt[iVar2] = (Table *)v;
  }
  in_RDI->top = in_RDI->top + -1;
  return 1;
}

Assistant:

static int lua_setmetatable(lua_State*L,int objindex){
TValue*obj;
Table*mt;
api_checknelems(L,1);
obj=index2adr(L,objindex);
api_checkvalidindex(L,obj);
if(ttisnil(L->top-1))
mt=NULL;
else{
luai_apicheck(L,ttistable(L->top-1));
mt=hvalue(L->top-1);
}
switch(ttype(obj)){
case 5:{
hvalue(obj)->metatable=mt;
if(mt)
luaC_objbarriert(L,hvalue(obj),mt);
break;
}
case 7:{
uvalue(obj)->metatable=mt;
if(mt)
luaC_objbarrier(L,rawuvalue(obj),mt);
break;
}
default:{
G(L)->mt[ttype(obj)]=mt;
break;
}
}
L->top--;
return 1;
}